

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::V0LayerParameter::V0LayerParameter(V0LayerParameter *this,V0LayerParameter *from)

{
  int iVar1;
  void *pvVar2;
  string *psVar3;
  FillerParameter *pFVar4;
  HDF5OutputParameter *this_00;
  long lVar5;
  uint32 *puVar6;
  uint32 *puVar7;
  byte bVar8;
  
  bVar8 = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__V0LayerParameter_0071f120;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  (this->blobs_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->blobs_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(from->blobs_).super_RepeatedPtrFieldBase);
  (this->blobs_lr_).current_size_ = 0;
  (this->blobs_lr_).total_size_ = 0;
  (this->blobs_lr_).rep_ = (Rep *)0x0;
  iVar1 = (from->blobs_lr_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->blobs_lr_,iVar1);
    memcpy(((this->blobs_lr_).rep_)->elements,((from->blobs_lr_).rep_)->elements,
           (long)(from->blobs_lr_).current_size_ << 2);
    (this->blobs_lr_).current_size_ = (from->blobs_lr_).current_size_;
  }
  (this->weight_decay_).current_size_ = 0;
  (this->weight_decay_).total_size_ = 0;
  (this->weight_decay_).rep_ = (Rep *)0x0;
  iVar1 = (from->weight_decay_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->weight_decay_,iVar1);
    memcpy(((this->weight_decay_).rep_)->elements,((from->weight_decay_).rep_)->elements,
           (long)(from->weight_decay_).current_size_ << 2);
    (this->weight_decay_).current_size_ = (from->weight_decay_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (psVar3 = (from->name_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar3);
  }
  (this->type_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 2) != 0) &&
     (psVar3 = (from->type_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->type_,psVar3);
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 4) != 0) &&
     (psVar3 = (from->source_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->source_,psVar3);
  }
  (this->meanfile_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 8) != 0) &&
     (psVar3 = (from->meanfile_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->meanfile_,psVar3);
  }
  (this->det_crop_mode_).ptr_ = (string *)&_default_det_crop_mode__abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 0x10) != 0) &&
     (psVar3 = (from->det_crop_mode_).ptr_, psVar3 != (string *)&_default_det_crop_mode__abi_cxx11_)
     ) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->det_crop_mode_,psVar3);
  }
  if (((from->_has_bits_).has_bits_[0] & 0x20) == 0) {
    pFVar4 = (FillerParameter *)0x0;
  }
  else {
    pFVar4 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar4,from->weight_filler_);
  }
  this->weight_filler_ = pFVar4;
  if (((from->_has_bits_).has_bits_[0] & 0x40) == 0) {
    pFVar4 = (FillerParameter *)0x0;
  }
  else {
    pFVar4 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar4,from->bias_filler_);
  }
  this->bias_filler_ = pFVar4;
  if (((from->_has_bits_).has_bits_[0] & 0x80) == 0) {
    this_00 = (HDF5OutputParameter *)0x0;
  }
  else {
    this_00 = (HDF5OutputParameter *)operator_new(0x20);
    HDF5OutputParameter::HDF5OutputParameter(this_00,from->hdf5_output_param_);
  }
  this->hdf5_output_param_ = this_00;
  puVar6 = &from->num_output_;
  puVar7 = &this->num_output_;
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)puVar7 = *(undefined8 *)puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -4 + 2;
    puVar7 = puVar7 + (ulong)bVar8 * -4 + 2;
  }
  return;
}

Assistant:

V0LayerParameter::V0LayerParameter(const V0LayerParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      blobs_(from.blobs_),
      blobs_lr_(from.blobs_lr_),
      weight_decay_(from.weight_decay_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_type()) {
    type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
  }
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  meanfile_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_meanfile()) {
    meanfile_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.meanfile_);
  }
  det_crop_mode_.UnsafeSetDefault(&V0LayerParameter::_default_det_crop_mode_.get());
  if (from.has_det_crop_mode()) {
    det_crop_mode_.AssignWithDefault(&V0LayerParameter::_default_det_crop_mode_.get(), from.det_crop_mode_);
  }
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  if (from.has_hdf5_output_param()) {
    hdf5_output_param_ = new ::caffe::HDF5OutputParameter(*from.hdf5_output_param_);
  } else {
    hdf5_output_param_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&det_fg_fraction_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(det_fg_fraction_));
  // @@protoc_insertion_point(copy_constructor:caffe.V0LayerParameter)
}